

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O0

int evp_keyex_init(ptls_key_exchange_algorithm_t *algo,ptls_key_exchange_context_t **_ctx,
                  EVP_PKEY *pkey)

{
  long lVar1;
  undefined8 in_RDX;
  undefined8 *in_RSI;
  undefined8 in_RDI;
  int ret;
  st_evp_keyex_context_t *ctx;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  code *local_40;
  undefined8 local_38;
  int local_2c;
  void *local_28;
  undefined8 local_20;
  undefined8 *local_18;
  undefined8 local_10;
  
  local_28 = (void *)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_28 = malloc(0x28);
  if (local_28 == (void *)0x0) {
    local_2c = 0x201;
  }
  else {
    local_58 = local_10;
    local_50 = 0;
    local_48 = 0;
    local_40 = evp_keyex_on_exchange;
    local_38 = local_20;
    memcpy(local_28,&local_58,0x28);
    lVar1 = EVP_PKEY_get1_encoded_public_key
                      (*(undefined8 *)((long)local_28 + 0x20),(long)local_28 + 8);
    *(long *)((long)local_28 + 0x10) = lVar1;
    if (lVar1 == 0) {
      *(undefined8 *)((long)local_28 + 8) = 0;
      return 0x201;
    }
    *local_18 = local_28;
    local_2c = 0;
  }
  if ((local_2c != 0) && (local_28 != (void *)0x0)) {
    evp_keyex_free((st_evp_keyex_context_t *)0x104d8c);
  }
  return local_2c;
}

Assistant:

static int evp_keyex_init(ptls_key_exchange_algorithm_t *algo, ptls_key_exchange_context_t **_ctx, EVP_PKEY *pkey)
{
    struct st_evp_keyex_context_t *ctx = NULL;
    int ret;

    /* instantiate */
    if ((ctx = malloc(sizeof(*ctx))) == NULL) {
        ret = PTLS_ERROR_NO_MEMORY;
        goto Exit;
    }
    *ctx = (struct st_evp_keyex_context_t){{algo, {NULL}, evp_keyex_on_exchange}, pkey};

    /* set public key */
    if ((ctx->super.pubkey.len = EVP_PKEY_get1_tls_encodedpoint(ctx->privkey, &ctx->super.pubkey.base)) == 0) {
        ctx->super.pubkey.base = NULL;
        return PTLS_ERROR_NO_MEMORY;
    }

    *_ctx = &ctx->super;
    ret = 0;
Exit:
    if (ret != 0 && ctx != NULL)
        evp_keyex_free(ctx);
    return ret;
}